

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseUnion
          (StructTranslator *this,Reader *decl,Reader members,MemberInfo *parent,Union *layout,
          uint *codeOrder)

{
  Arena *this_00;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  uint uVar2;
  uint uVar3;
  MemberInfo **ppMVar4;
  MemberInfo **ppMVar5;
  Reader parent_00;
  Reader members_00;
  Reader parent_01;
  Reader members_01;
  Reader decl_00;
  Reader decl_01;
  bool bVar6;
  short sVar7;
  int iVar8;
  Group *pGVar9;
  MemberInfo *pMVar10;
  Union *layout_00;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  ElementCount index;
  Reader RVar14;
  uint subCodeOrder;
  Reader member;
  bool local_1d4 [4];
  StructReader local_1d0;
  MemberInfo *local_1a0;
  PointerReader local_198;
  multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
  *local_178;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_170;
  Union *local_168;
  uint *local_160;
  ElementCount local_154;
  StructBuilder *local_150;
  NodeSourceInfoBuilderPair local_148;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_f8;
  ListReader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ListReader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1a0 = parent;
  local_168 = layout;
  local_160 = codeOrder;
  if (members.reader.elementCount < 2) {
    uVar2 = (decl->_reader).dataSize;
    uVar11 = 0;
    uVar12 = 0;
    if (0x3f < uVar2) {
      uVar12 = (ulong)*(uint *)((long)(decl->_reader).data + 4);
    }
    if (0x5f < uVar2) {
      uVar11 = (ulong)*(uint *)((long)(decl->_reader).data + 8);
    }
    (**this->errorReporter->_vptr_ErrorReporter)
              (this->errorReporter,uVar12,uVar11,"Union must have at least two members.",0x26);
  }
  local_154 = members.reader.elementCount;
  if (members.reader.elementCount != 0) {
    this_00 = &this->arena;
    local_150 = &(local_1a0->node)._builder;
    local_170 = &this->allMembers;
    local_178 = &this->membersByOrdinal;
    index = 0;
    local_f8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)local_178;
    do {
      capnp::_::ListReader::getStructElement(&local_1d0,&members.reader,index);
      pMVar10 = local_1a0;
      if (local_1d0.dataSize < 0x20) {
        sVar7 = 0;
      }
      else {
        sVar7 = *(short *)((long)local_1d0.data + 2);
      }
      if (sVar7 == 8) {
        local_1a0->childCount = local_1a0->childCount + 1;
        pGVar9 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_168);
        uVar3 = *local_160;
        *local_160 = uVar3 + 1;
        local_198.segment = (SegmentReader *)CONCAT44(local_198.segment._4_4_,uVar3);
        capnp::_::StructBuilder::asReader(local_150);
        decl_00._reader.pointerCount = local_1d0.pointerCount;
        decl_00._reader.dataSize = local_1d0.dataSize;
        decl_00._reader._38_2_ = local_1d0._38_2_;
        decl_00._reader._44_4_ = local_1d0._44_4_;
        decl_00._reader.nestingLimit = local_1d0.nestingLimit;
        parent_00._reader.capTable = (CapTableReader *)uStack_b8;
        parent_00._reader.segment = (SegmentReader *)local_c0;
        parent_00._reader.data = (void *)local_b0;
        parent_00._reader.pointers = (WirePointer *)uStack_a8;
        parent_00._reader.dataSize = (undefined4)local_a0;
        parent_00._reader.pointerCount = local_a0._4_2_;
        parent_00._reader._38_2_ = local_a0._6_2_;
        parent_00._reader._40_8_ = uStack_98;
        decl_00._reader.capTable = local_1d0.capTable;
        decl_00._reader.segment = local_1d0.segment;
        decl_00._reader.data = local_1d0.data;
        decl_00._reader.pointers = local_1d0.pointers;
        newGroupNode(&local_148,this,parent_00,decl_00);
        local_1d4[0] = true;
        pMVar10 = kj::Arena::
                  allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                            (this_00,local_1a0,(uint *)&local_198,(Reader *)&local_1d0,&local_148,
                             local_1d4);
        ppMVar4 = (this->allMembers).builder.endPtr;
        if ((this->allMembers).builder.pos == ppMVar4) {
          ppMVar5 = (local_170->builder).ptr;
          sVar13 = (long)ppMVar4 - (long)ppMVar5 >> 2;
          if (ppMVar4 == ppMVar5) {
            sVar13 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_170,sVar13);
        }
        *(this->allMembers).builder.pos = pMVar10;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        if (local_1d0.pointerCount < 3) {
          local_148.node._builder.pointers._0_4_ = 0x7fffffff;
          local_148.node._builder.capTable = (CapTableBuilder *)0x0;
          local_148.node._builder.data = (WirePointer *)0x0;
          local_148.node._builder.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_148.node._builder.data = local_1d0.pointers + 2;
          local_148.node._builder.capTable = (CapTableBuilder *)local_1d0.capTable;
          local_148.node._builder.segment = (SegmentBuilder *)local_1d0.segment;
          local_148.node._builder.pointers._0_4_ = local_1d0.nestingLimit;
        }
        bVar6 = false;
        capnp::_::PointerReader::getList
                  (&local_f0,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
        members_00.reader.capTable = local_f0.capTable;
        members_00.reader.segment = local_f0.segment;
        members_00.reader.ptr = local_f0.ptr;
        members_00.reader.elementCount = local_f0.elementCount;
        members_00.reader.step = local_f0.step;
        members_00.reader.structDataSize = local_f0.structDataSize;
        members_00.reader.structPointerCount = local_f0.structPointerCount;
        members_00.reader.elementSize = local_f0.elementSize;
        members_00.reader._39_1_ = local_f0._39_1_;
        members_00.reader.nestingLimit = local_f0.nestingLimit;
        members_00.reader._44_4_ = local_f0._44_4_;
        traverseGroup(this,members_00,pMVar10,&pGVar9->super_StructOrGroup);
      }
      else if (sVar7 == 7) {
        local_198.capTable = local_1d0.capTable;
        local_198.pointer = local_1d0.pointers;
        local_198.segment = local_1d0.segment;
        local_198.nestingLimit = local_1d0.nestingLimit;
        if (local_1d0.pointerCount == 0) {
          local_198.capTable = (CapTableReader *)(MemberInfo *)0x0;
          local_198.pointer = (WirePointer *)0x0;
          local_198.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
          local_198.nestingLimit = 0x7fffffff;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_198,(word *)0x0);
        local_198.pointer = (WirePointer *)0x0;
        local_198.capTable = (CapTableReader *)(MemberInfo *)0x0;
        local_198.segment = &((SegmentBuilder *)0x0)->super_SegmentReader;
        local_198.nestingLimit = 0x7fffffff;
        if (local_148.node._builder.pointerCount != 0) {
          local_198.pointer =
               (WirePointer *)
               CONCAT44(local_148.node._builder.pointers._4_4_,(int)local_148.node._builder.pointers
                       );
          local_198.capTable = &(local_148.node._builder.capTable)->super_CapTableReader;
          local_198.segment = &(local_148.node._builder.segment)->super_SegmentReader;
          local_198.nestingLimit = (int)local_148.sourceInfo._builder.segment;
        }
        RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_198,(void *)0x0,0);
        if ((RVar14.super_StringPtr.content.size_ == 1) &&
           (iVar8 = bcmp(RVar14.super_StringPtr.content.ptr,"",1), iVar8 == 0)) {
          uVar11 = 0;
          uVar12 = 0;
          if (0x3f < local_1d0.dataSize) {
            uVar12 = (ulong)*(uint *)((long)local_1d0.data + 4);
          }
          if (0x5f < local_1d0.dataSize) {
            uVar11 = (ulong)*(uint *)((long)local_1d0.data + 8);
          }
          (**this->errorReporter->_vptr_ErrorReporter)
                    (this->errorReporter,uVar12,uVar11,"Unions cannot contain unnamed unions.",0x26)
          ;
          goto LAB_00173f8f;
        }
        local_1a0->childCount = local_1a0->childCount + 1;
        pGVar9 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_168);
        layout_00 = kj::Arena::
                    allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::Group&>
                              (this_00,pGVar9);
        uVar3 = *local_160;
        *local_160 = uVar3 + 1;
        local_198.segment = (SegmentReader *)CONCAT44(local_198.segment._4_4_,uVar3);
        capnp::_::StructBuilder::asReader(local_150);
        decl_01._reader.pointerCount = local_1d0.pointerCount;
        decl_01._reader.dataSize = local_1d0.dataSize;
        decl_01._reader._38_2_ = local_1d0._38_2_;
        decl_01._reader._44_4_ = local_1d0._44_4_;
        decl_01._reader.nestingLimit = local_1d0.nestingLimit;
        parent_01._reader.capTable = (CapTableReader *)uStack_58;
        parent_01._reader.segment = (SegmentReader *)local_60;
        parent_01._reader.data = (void *)local_50;
        parent_01._reader.pointers = (WirePointer *)uStack_48;
        parent_01._reader.dataSize = (undefined4)local_40;
        parent_01._reader.pointerCount = local_40._4_2_;
        parent_01._reader._38_2_ = local_40._6_2_;
        parent_01._reader._40_8_ = uStack_38;
        decl_01._reader.capTable = local_1d0.capTable;
        decl_01._reader.segment = local_1d0.segment;
        decl_01._reader.data = local_1d0.data;
        decl_01._reader.pointers = local_1d0.pointers;
        newGroupNode(&local_148,this,parent_01,decl_01);
        local_1d4[0] = true;
        pMVar10 = kj::Arena::
                  allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                            (this_00,local_1a0,(uint *)&local_198,(Reader *)&local_1d0,&local_148,
                             local_1d4);
        ppMVar4 = (this->allMembers).builder.endPtr;
        if ((this->allMembers).builder.pos == ppMVar4) {
          ppMVar5 = (local_170->builder).ptr;
          sVar13 = (long)ppMVar4 - (long)ppMVar5 >> 2;
          if (ppMVar4 == ppMVar5) {
            sVar13 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_170,sVar13);
        }
        *(this->allMembers).builder.pos = pMVar10;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        (pMVar10->field_21).unionScope = layout_00;
        local_1d4[0] = false;
        local_1d4[1] = false;
        local_1d4[2] = false;
        local_1d4[3] = false;
        if (local_1d0.pointerCount < 3) {
          local_148.node._builder.pointers._0_4_ = 0x7fffffff;
          local_148.node._builder.capTable = (CapTableBuilder *)0x0;
          local_148.node._builder.data = (WirePointer *)0x0;
          local_148.node._builder.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_148.node._builder.data = local_1d0.pointers + 2;
          local_148.node._builder.capTable = (CapTableBuilder *)local_1d0.capTable;
          local_148.node._builder.segment = (SegmentBuilder *)local_1d0.segment;
          local_148.node._builder.pointers._0_4_ = local_1d0.nestingLimit;
        }
        capnp::_::PointerReader::getList
                  (&local_90,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
        members_01.reader.capTable = local_90.capTable;
        members_01.reader.segment = local_90.segment;
        members_01.reader.ptr = local_90.ptr;
        members_01.reader.elementCount = local_90.elementCount;
        members_01.reader.step = local_90.step;
        members_01.reader.structDataSize = local_90.structDataSize;
        members_01.reader.structPointerCount = local_90.structPointerCount;
        members_01.reader.elementSize = local_90.elementSize;
        members_01.reader._39_1_ = local_90._39_1_;
        members_01.reader.nestingLimit = local_90.nestingLimit;
        members_01.reader._44_4_ = local_90._44_4_;
        traverseUnion(this,(Reader *)&local_1d0,members_01,pMVar10,layout_00,(uint *)local_1d4);
        if ((0xf < local_1d0.dataSize) && (*local_1d0.data == 2)) {
          if (local_1d0.pointerCount < 2) {
            local_198.nestingLimit = 0x7fffffff;
            local_198.capTable = (CapTableReader *)0x0;
            local_198.pointer = (WirePointer *)0x0;
            local_198.segment = (SegmentReader *)0x0;
          }
          else {
            local_198.pointer = local_1d0.pointers + 1;
            local_198.capTable = local_1d0.capTable;
            local_198.segment = local_1d0.segment;
            local_198.nestingLimit = local_1d0.nestingLimit;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_198,(word *)0x0);
          local_178 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                       *)0x0;
          goto LAB_00173bc6;
        }
        bVar6 = false;
      }
      else if (sVar7 == 6) {
        local_1a0->childCount = local_1a0->childCount + 1;
        pGVar9 = kj::Arena::
                 allocate<capnp::compiler::NodeTranslator::StructLayout::Group,capnp::compiler::NodeTranslator::StructLayout::Union&>
                           (this_00,local_168);
        uVar3 = *local_160;
        *local_160 = uVar3 + 1;
        local_148.node._builder.segment =
             (SegmentBuilder *)CONCAT44(local_148.node._builder.segment._4_4_,uVar3);
        local_198.segment = (SegmentReader *)CONCAT71(local_198.segment._1_7_,1);
        pMVar10 = kj::Arena::
                  allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::Group&,bool>
                            (this_00,pMVar10,(uint *)&local_148,(Reader *)&local_1d0,pGVar9,
                             (bool *)&local_198);
        ppMVar4 = (this->allMembers).builder.endPtr;
        if ((this->allMembers).builder.pos == ppMVar4) {
          ppMVar5 = (local_170->builder).ptr;
          sVar13 = (long)ppMVar4 - (long)ppMVar5 >> 2;
          if (ppMVar4 == ppMVar5) {
            sVar13 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                    (local_170,sVar13);
        }
        *(this->allMembers).builder.pos = pMVar10;
        pppMVar1 = &(this->allMembers).builder.pos;
        *pppMVar1 = *pppMVar1 + 1;
        if (local_1d0.pointerCount < 2) {
          local_198.nestingLimit = 0x7fffffff;
          local_198.capTable = (CapTableReader *)0x0;
          local_198.pointer = (WirePointer *)0x0;
          local_198.segment = (SegmentReader *)0x0;
        }
        else {
          local_198.pointer = local_1d0.pointers + 1;
          local_198.capTable = local_1d0.capTable;
          local_198.segment = local_1d0.segment;
          local_198.nestingLimit = local_1d0.nestingLimit;
        }
        local_178 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                     *)0x0;
        capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_198,(word *)0x0);
LAB_00173bc6:
        if (0x3f < local_148.node._builder.dataSize) {
          local_178 = (multimap<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>_>_>
                       *)(ulong)((WireValue<uint32_t> *)local_148.node._builder.data)->value;
        }
        bVar6 = true;
      }
      else {
LAB_00173f8f:
        bVar6 = false;
        pMVar10 = (MemberInfo *)0x0;
      }
      if (bVar6) {
        local_148.node._builder.segment =
             (SegmentBuilder *)CONCAT44(local_148.node._builder.segment._4_4_,(int)local_178);
        local_148.node._builder.capTable = (CapTableBuilder *)pMVar10;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
        ::
        _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                  (local_f8,(pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                             *)&local_148);
      }
      index = index + 1;
    } while (local_154 != index);
  }
  return;
}

Assistant:

void traverseUnion(const Declaration::Reader& decl,
                     List<Declaration>::Reader members, MemberInfo& parent,
                     StructLayout::Union& layout, uint& codeOrder) {
    if (members.size() < 2) {
      errorReporter.addErrorOn(decl, "Union must have at least two members.");
    }

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          // For layout purposes, pretend this field is enclosed in a one-member group.
          StructLayout::Group& singletonGroup =
              arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(parent, codeOrder++, member, singletonGroup,
                                                   true);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION:
          if (member.getName().getValue() == "") {
            errorReporter.addErrorOn(member, "Unions cannot contain unnamed unions.");
          } else {
            parent.childCount++;

            // For layout purposes, pretend this union is enclosed in a one-member group.
            StructLayout::Group& singletonGroup =
                arena.allocate<StructLayout::Group>(layout);
            StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(singletonGroup);

            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                true);
            allMembers.add(memberInfo);
            memberInfo->unionScope = &unionLayout;
            uint subCodeOrder = 0;
            traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, subCodeOrder);
            if (member.getId().isOrdinal()) {
              ordinal = member.getId().getOrdinal().getValue();
            }
          }
          break;

        case Declaration::GROUP: {
          parent.childCount++;
          StructLayout::Group& group = arena.allocate<StructLayout::Group>(layout);
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              true);
          allMembers.add(memberInfo);
          traverseGroup(member.getNestedDecls(), *memberInfo, group);
          break;
        }

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }